

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MAi_inform_base(Integer datatype,Pointer address1,Pointer address2)

{
  char *in_RDX;
  Pointer in_RSI;
  long in_RDI;
  Boolean local_8;
  
  if (ma_initialized == 0) {
    if ((in_RDI < 1000) || (0x3f8 < in_RDI)) {
      sprintf(ma_ebuf,"invalid datatype: %ld",in_RDI);
      ma_error((ErrorLevel)((ulong)in_RDI >> 0x20),(ErrorType)in_RDI,in_RSI,in_RDX);
      local_8 = 0;
    }
    else {
      ma_base[in_RDI + -1000] = in_RSI;
      ma_sizeof[in_RDI + -1000] = (int)in_RDX - (int)in_RSI;
      local_8 = 1;
    }
  }
  else {
    sprintf(ma_ebuf,"MA already initialized");
    ma_error((ErrorLevel)((ulong)in_RDI >> 0x20),(ErrorType)in_RDI,in_RSI,in_RDX);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

public Boolean MAi_inform_base(datatype, address1, address2)
    Integer    datatype;    /* to set size of */
    Pointer    address1;    /* of datatype element base */
    Pointer    address2;    /* of an adjacent datatype element */
{
    /* verify uninitialization */
    if (ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA already initialized");
        ma_error(EL_Nonfatal, ET_Internal, "MAi_inform_base", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Nonfatal, ET_Internal, "MAi_inform_base", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /* set the base address of datatype */
    ma_base[datatype] = address1;

    /* set the size of datatype */
    ma_sizeof[datatype] = (int)(address2 - address1);

    /* success */
    return MA_TRUE;
}